

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O1

void sfd_start_conn(sfd_listener *l,nni_aio *aio)

{
  int iVar1;
  int fd;
  nng_err result;
  nni_sfd_conn *local_30;
  nni_sfd_conn *c;
  
  if (l->listen_cnt < 1) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sockfd.c",
              0x56,"l->listen_cnt > 0");
  }
  iVar1 = l->listen_cnt;
  fd = l->listen_q[0];
  if (1 < iVar1) {
    memmove(l->listen_q + 1,l->listen_q + 2,(ulong)(iVar1 - 1) << 2);
  }
  l->listen_cnt = iVar1 + -1;
  result = nni_sfd_conn_alloc(&local_30,fd);
  if (result == NNG_OK) {
    nni_aio_set_output(aio,0,local_30);
    nni_aio_finish(aio,NNG_OK,0);
  }
  else {
    nni_aio_finish_error(aio,result);
    nni_sfd_close_fd(fd);
  }
  return;
}

Assistant:

static void
sfd_start_conn(sfd_listener *l, nni_aio *aio)
{
	int           fd;
	int           rv;
	nni_sfd_conn *c;
	NNI_ASSERT(l->listen_cnt > 0);
	fd = l->listen_q[0];
	for (int i = 1; i < l->listen_cnt; i++) {
		l->listen_q[i] = l->listen_q[i + 1];
	}
	l->listen_cnt--;
	if ((rv = nni_sfd_conn_alloc(&c, fd)) != 0) {
		nni_aio_finish_error(aio, rv);
		nni_sfd_close_fd(fd);
	} else {
		nni_aio_set_output(aio, 0, c);
		nni_aio_finish(aio, 0, 0);
	}
}